

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetScrollHereY(float center_y_ratio)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *window;
  undefined1 auVar3 [16];
  float fVar4;
  undefined1 auVar5 [16];
  
  window = GImGui->CurrentWindow;
  fVar1 = (GImGui->Style).ItemSpacing.y;
  fVar2 = (window->DC).CursorPosPrevLine.y;
  fVar4 = fVar2 - fVar1;
  SetScrollFromPosY(window,(((fVar1 + fVar2 + (window->DC).PrevLineSize.y) - fVar4) * center_y_ratio
                           + fVar4) - (window->Pos).y,center_y_ratio);
  auVar5 = ZEXT416((uint)((window->WindowPadding).y - fVar1));
  auVar3 = vcmpss_avx(auVar5,ZEXT816(0) << 0x40,2);
  auVar3 = vandnps_avx(auVar3,auVar5);
  (window->ScrollTargetEdgeSnapDist).y = auVar3._0_4_;
  return;
}

Assistant:

void ImGui::SetScrollHereY(float center_y_ratio)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float spacing_y = g.Style.ItemSpacing.y;
    float target_pos_y = ImLerp(window->DC.CursorPosPrevLine.y - spacing_y, window->DC.CursorPosPrevLine.y + window->DC.PrevLineSize.y + spacing_y, center_y_ratio);
    SetScrollFromPosY(window, target_pos_y - window->Pos.y, center_y_ratio); // Convert from absolute to local pos

    // Tweak: snap on edges when aiming at an item very close to the edge
    window->ScrollTargetEdgeSnapDist.y = ImMax(0.0f, window->WindowPadding.y - spacing_y);
}